

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashMap.h
# Opt level: O2

int __thiscall
btHashMap<btHashString,_btCollisionShape_*>::findIndex
          (btHashMap<btHashString,_btCollisionShape_*> *this,btHashString *key)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  int *piVar6;
  
  uVar4 = (long)(this->m_valueArray).m_capacity - 1U & (long)(int)key->m_hash;
  iVar3 = -1;
  if ((uint)uVar4 < (uint)(this->m_hashTable).m_size) {
    piVar6 = (this->m_hashTable).m_data + uVar4;
    while( true ) {
      iVar1 = *piVar6;
      lVar5 = (long)iVar1;
      iVar3 = -1;
      if ((lVar5 == -1) ||
         (bVar2 = btHashString::equals(key,(this->m_keyArray).m_data + lVar5), iVar3 = iVar1, bVar2)
         ) break;
      piVar6 = (this->m_next).m_data + lVar5;
    }
  }
  return iVar3;
}

Assistant:

SIMD_FORCE_INLINE	unsigned int getHash()const
	{
		return m_hash;
	}